

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall
r_comp::Compiler::read_class
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  Atom *this_00;
  Class _p;
  string label;
  Ptr local_1b8;
  Ptr local_1a8;
  ulong local_198;
  Class local_190;
  key_type local_148;
  Class local_128;
  undefined1 local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_b0;
  ReturnType local_98;
  Iteration IStack_94;
  Atom local_90 [8];
  _Alloc_hider local_88;
  char local_78 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_68;
  ReturnType local_50;
  Iteration IStack_4c;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_48;
  
  iVar2 = std::__cxx11::string::compare
                    ((char *)&((node->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->label);
  if (iVar2 == 0) {
    return false;
  }
  std::__cxx11::string::substr
            ((ulong)&local_148,
             (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->label);
  Class::Class(&local_190,ANY);
  local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = object(this,&local_1a8,&local_190);
  if (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (!bVar1) {
    local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    if (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar1 = marker(this,&local_1b8,&local_190);
    if (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0012b76d;
    }
  }
  Class::Class(&local_128,ANY);
  local_198 = (ulong)write_index;
  Reference::Reference((Reference *)local_e0,local_198,&local_190,&local_128);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->local_references,&local_148);
  pmVar3->index = local_e0._0_8_;
  r_code::Atom::operator=(&(pmVar3->_class).atom,(Atom *)(local_e0 + 8));
  std::__cxx11::string::operator=((string *)&(pmVar3->_class).str_opcode,(string *)&local_d0);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::_M_move_assign
            (&(pmVar3->_class).things_to_read,&local_b0);
  (pmVar3->_class).type = local_98;
  (pmVar3->_class).use_as = IStack_94;
  r_code::Atom::operator=(&(pmVar3->cast_class).atom,local_90);
  std::__cxx11::string::operator=((string *)&(pmVar3->cast_class).str_opcode,(string *)&local_88);
  local_48.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar3->cast_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_48.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar3->cast_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar3->cast_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (pmVar3->cast_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  (pmVar3->cast_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar3->cast_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&local_48)
  ;
  (pmVar3->cast_class).type = local_50;
  (pmVar3->cast_class).use_as = IStack_4c;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&local_68)
  ;
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  r_code::Atom::~Atom(local_90);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&local_b0)
  ;
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  r_code::Atom::~Atom((Atom *)(local_e0 + 8));
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_128.things_to_read);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.str_opcode._M_dataplus._M_p != &local_128.str_opcode.field_2) {
    operator_delete(local_128.str_opcode._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(&local_128.atom);
  bVar1 = true;
  if (write) {
    this_00 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),local_198);
    r_code::Atom::operator=(this_00,&local_190.atom);
  }
LAB_0012b76d:
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_190.things_to_read);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.str_opcode._M_dataplus._M_p != &local_190.str_opcode.field_2) {
    operator_delete(local_190.str_opcode._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(&local_190.atom);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool Compiler::read_class(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL.
{
    if (node->label != "") {
        std::string label = node->label.substr(0, node->label.size() - 1);
        Class _p;

        if (!object(node, _p)) {
            if (!marker(node, _p)) {
                return false;
            }
        }

        local_references[label] = Reference(write_index, _p, Class());

        if (write) {
            current_object->code[write_index] = _p.atom;
        }

        return true;
    }

    return false;
}